

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

double CECoordinates::HMSToAngle
                 (vector<double,_std::allocator<double>_> *angle,CEAngleType *return_type)

{
  int *in_RSI;
  CEAngle ret_angle;
  double *in_stack_ffffffffffffff98;
  CEAngle *this;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  CEAngle local_40;
  double local_30;
  CEAngle local_28;
  int *local_18;
  double local_8;
  
  this = &local_40;
  local_18 = in_RSI;
  CEAngle::Hms(in_stack_ffffffffffffffa8);
  local_30 = CEAngle::operator_cast_to_double(this);
  CEAngle::CEAngle(this,in_stack_ffffffffffffff98);
  CEAngle::~CEAngle((CEAngle *)0x12d26b);
  if (*local_18 == 0) {
    local_8 = CEAngle::Deg(&local_28);
  }
  else {
    local_8 = CEAngle::Rad(&local_28);
  }
  CEAngle::~CEAngle((CEAngle *)0x12d301);
  return local_8;
}

Assistant:

double CECoordinates::HMSToAngle(const std::vector<double>& angle,
                                 const CEAngleType& return_type)
{
    CEAngle ret_angle = CEAngle::Hms(angle);

    if (return_type == CEAngleType::DEGREES) {
        return ret_angle.Deg();
    } else {
        return ret_angle.Rad();
    }
}